

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderConfig.cpp
# Opt level: O1

void glu::parseRenderConfig(RenderConfig *config,CommandLine *cmdLine)

{
  SurfaceType SVar1;
  Visibility VVar2;
  int iVar3;
  char *pcVar4;
  InternalError *this;
  string local_40;
  
  SVar1 = tcu::CommandLine::getSurfaceType(cmdLine);
  if (SVar1 < (SURFACETYPE_LAST|SURFACETYPE_OFFSCREEN_NATIVE)) {
    config->surfaceType = *(SurfaceType *)(&DAT_00b9ac5c + (ulong)SVar1 * 4);
    VVar2 = parseWindowVisibility(cmdLine);
    config->windowVisibility = VVar2;
    iVar3 = tcu::CommandLine::getSurfaceWidth(cmdLine);
    if (0 < iVar3) {
      iVar3 = tcu::CommandLine::getSurfaceWidth(cmdLine);
      config->width = iVar3;
    }
    iVar3 = tcu::CommandLine::getSurfaceHeight(cmdLine);
    if (0 < iVar3) {
      iVar3 = tcu::CommandLine::getSurfaceHeight(cmdLine);
      config->height = iVar3;
    }
    pcVar4 = tcu::CommandLine::getGLConfigName(cmdLine);
    if (pcVar4 != (char *)0x0) {
      pcVar4 = tcu::CommandLine::getGLConfigName(cmdLine);
      parseConfigBitsFromName(config,pcVar4);
    }
    iVar3 = tcu::CommandLine::getGLConfigId(cmdLine);
    if (-1 < iVar3) {
      iVar3 = tcu::CommandLine::getGLConfigId(cmdLine);
      config->id = iVar3;
    }
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Unsupported surface type","")
  ;
  tcu::InternalError::InternalError(this,&local_40);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void parseRenderConfig (RenderConfig* config, const tcu::CommandLine& cmdLine)
{
	switch (cmdLine.getSurfaceType())
	{
		case tcu::SURFACETYPE_WINDOW:				config->surfaceType		= RenderConfig::SURFACETYPE_WINDOW;				break;
		case tcu::SURFACETYPE_OFFSCREEN_NATIVE:		config->surfaceType		= RenderConfig::SURFACETYPE_OFFSCREEN_NATIVE;	break;
		case tcu::SURFACETYPE_OFFSCREEN_GENERIC:	config->surfaceType		= RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC;	break;
		case tcu::SURFACETYPE_FBO:					config->surfaceType		= RenderConfig::SURFACETYPE_DONT_CARE;			break;
		case tcu::SURFACETYPE_LAST:					config->surfaceType		= RenderConfig::SURFACETYPE_DONT_CARE;			break;
		default:
			throw tcu::InternalError("Unsupported surface type");
	}

	config->windowVisibility = parseWindowVisibility(cmdLine);

	if (cmdLine.getSurfaceWidth() > 0)
		config->width = cmdLine.getSurfaceWidth();

	if (cmdLine.getSurfaceHeight() > 0)
		config->height = cmdLine.getSurfaceHeight();

	if (cmdLine.getGLConfigName() != DE_NULL)
		parseConfigBitsFromName(config, cmdLine.getGLConfigName());

	if (cmdLine.getGLConfigId() >= 0)
		config->id = cmdLine.getGLConfigId();
}